

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O0

string * __thiscall iDynTree::LinkPositions::toString_abi_cxx11_(LinkPositions *this,Model *model)

{
  ostream *poVar1;
  string *in_RDI;
  size_t l;
  size_t nrOfLinks;
  stringstream ss;
  ostream *in_stack_fffffffffffffdc8;
  string local_200 [32];
  string local_1e0 [48];
  ulong local_1b0;
  ulong local_1a8;
  stringstream local_1a0 [16];
  ostream local_190 [320];
  LinkIndex in_stack_ffffffffffffffb0;
  Model *in_stack_ffffffffffffffb8;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a8 = getNrOfLinks((LinkPositions *)0x437580);
  for (local_1b0 = 0; local_1b0 < local_1a8; local_1b0 = local_1b0 + 1) {
    poVar1 = std::operator<<(local_190,"Position for link ");
    Model::getLinkName_abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    poVar1 = std::operator<<(poVar1,local_1e0);
    poVar1 = std::operator<<(poVar1,":");
    operator()((LinkPositions *)poVar1,(LinkIndex)in_stack_fffffffffffffdc8);
    iDynTree::Transform::toString_abi_cxx11_();
    in_stack_fffffffffffffdc8 = std::operator<<(poVar1,local_200);
    std::ostream::operator<<(in_stack_fffffffffffffdc8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_1e0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string LinkPositions::toString(const Model& model) const
{
   std::stringstream ss;

    size_t nrOfLinks = this->getNrOfLinks();
    for(size_t l=0; l < nrOfLinks; l++)
    {
        ss << "Position for link " << model.getLinkName(l) << ":" << this->operator()(l).toString() << std::endl;
    }
    return ss.str();
}